

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2PrintHandlers.cpp
# Opt level: O0

void __thiscall
SAX2PrintHandlers::endElement(SAX2PrintHandlers *this,XMLCh *uri,XMLCh *localname,XMLCh *qname)

{
  int iVar1;
  XMLFormatter *pXVar2;
  XMLCh *qname_local;
  XMLCh *localname_local;
  XMLCh *uri_local;
  SAX2PrintHandlers *this_local;
  
  pXVar2 = xercesc_4_0::XMLFormatter::operator<<(&this->fFormatter,NoEscapes);
  xercesc_4_0::XMLFormatter::operator<<(pXVar2,L"</");
  if ((this->fExpandNS & 1U) == 0) {
    pXVar2 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(&this->fFormatter,qname);
    xercesc_4_0::XMLFormatter::operator<<(pXVar2,L'>');
  }
  else {
    iVar1 = xercesc_4_0::XMLString::compareIString
                      (uri,(wchar16 *)&xercesc_4_0::XMLUni::fgZeroLenString);
    if (iVar1 != 0) {
      pXVar2 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(&this->fFormatter,uri);
      xercesc_4_0::XMLFormatter::operator<<(pXVar2,L':');
    }
    pXVar2 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(&this->fFormatter,localname);
    xercesc_4_0::XMLFormatter::operator<<(pXVar2,L'>');
  }
  return;
}

Assistant:

void SAX2PrintHandlers::endElement(const XMLCh* const uri,
								 const XMLCh* const localname,
								 const XMLCh* const qname)
{
    // No escapes are legal here
    fFormatter << XMLFormatter::NoEscapes << gEndElement ;
	if ( fExpandNS )
	{
		if (XMLString::compareIString(uri,XMLUni::fgZeroLenString) != 0)
				fFormatter  << uri << chColon;
		fFormatter << localname << chCloseAngle;
	}
	else
		fFormatter << qname << chCloseAngle;
}